

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

Bool Line_Down(black_PWorker worker,Long x1,Long y1,Long x2,Long y2,Long miny,Long maxy)

{
  char cVar1;
  Bool BVar2;
  Bool fresh;
  Bool result;
  Long miny_local;
  Long y2_local;
  Long x2_local;
  Long y1_local;
  Long x1_local;
  black_PWorker worker_local;
  
  cVar1 = worker->fresh;
  BVar2 = Line_Up(worker,x1,-y1,x2,-y2,-maxy,-miny);
  if ((cVar1 != '\0') && (worker->fresh == '\0')) {
    worker->cProfile->start = -worker->cProfile->start;
  }
  return BVar2;
}

Assistant:

static Bool
  Line_Down( RAS_ARGS Long  x1,
                      Long  y1,
                      Long  x2,
                      Long  y2,
                      Long  miny,
                      Long  maxy )
  {
    Bool  result, fresh;


    fresh  = ras.fresh;

    result = Line_Up( RAS_VARS x1, -y1, x2, -y2, -maxy, -miny );

    if ( fresh && !ras.fresh )
      ras.cProfile->start = -ras.cProfile->start;

    return result;
  }